

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

Byte ppmd_read(void *p)

{
  long lVar1;
  Byte *pBVar2;
  Byte BVar3;
  
  lVar1 = *(long *)(*p)[0x15].archive_format_name;
  if (*(long *)(lVar1 + 0x4dd0) == 0) {
    BVar3 = '\0';
    archive_set_error(*p,0x54,"Truncated RAR file data");
    *(undefined4 *)(lVar1 + 0x4df8) = 1;
  }
  else {
    pBVar2 = *(Byte **)(lVar1 + 0x4dc8);
    *(Byte **)(lVar1 + 0x4dc8) = pBVar2 + 1;
    BVar3 = *pBVar2;
    *(long *)(lVar1 + 0x4dd0) = *(long *)(lVar1 + 0x4dd0) + -1;
    *(long *)(lVar1 + 0x4dd8) = *(long *)(lVar1 + 0x4dd8) + 1;
  }
  return BVar3;
}

Assistant:

static Byte
ppmd_read(void *p)
{
  struct archive_read *a = ((IByteIn*)p)->a;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);
  Byte b;
  if (!rar_br_read_ahead(a, br, 8))
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Truncated RAR file data");
    rar->valid = 0;
    return 0;
  }
  b = rar_br_bits(br, 8);
  rar_br_consume(br, 8);
  return b;
}